

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogUnixServer.cpp
# Opt level: O0

void * liblogger::LogUnixServer::Run(void *arg)

{
  int iVar1;
  long in_RDI;
  int nclient;
  socklen_t addr_len;
  sockaddr_un addr;
  int ret;
  pollfd fds [2];
  bool busy;
  LogUnixServer *self;
  socklen_t local_a0 [2];
  value_type_conflict3 *in_stack_ffffffffffffff68;
  list<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  pollfd local_28;
  undefined4 local_20;
  undefined2 local_1c;
  ushort local_1a;
  byte local_11;
  long local_10;
  
  local_11 = 1;
  local_10 = in_RDI;
  while( true ) {
    if ((local_11 & 1) == 0) {
      return (void *)0x0;
    }
    local_28.fd = *(int *)(local_10 + 0x70);
    local_28.events = 1;
    local_28.revents = 0;
    local_20 = *(undefined4 *)(local_10 + 0x74);
    local_1c = 1;
    local_1a = 0;
    iVar1 = poll(&local_28,2,0);
    if (iVar1 < 0) break;
    if ((local_28.revents & 1U) != 0) {
      local_a0[0] = 0x6e;
      iVar1 = accept(*(int *)(local_10 + 0x70),(sockaddr *)((long)local_a0 + 6),local_a0);
      if (-1 < iVar1) {
        Lock((LogUnixServer *)0x1af934);
        std::__cxx11::list<int,_std::allocator<int>_>::push_back
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        Unlock((LogUnixServer *)0x1af957);
      }
    }
    if ((local_1a & 1) != 0) {
      local_11 = 0;
    }
  }
  __errno_location();
  abort();
}

Assistant:

void *LogUnixServer::Run(void *arg)
{
	LogUnixServer *self = (LogUnixServer *) arg;

	bool busy = true;
	while(busy)
	{
		struct pollfd fds[2];

		fds[0].fd = self->m_acceptfd;
		fds[0].events = POLLIN;
		fds[0].revents = 0;

		fds[1].fd = self->m_ctlfd[0];
		fds[1].events = POLLIN;
		fds[1].revents = 0;

		int ret = poll(fds, 2, 0);
		if (ret < 0)
		{
			switch(errno)
			{
				default:
					abort();
			}
		}

		if ( (fds[0].revents & POLLIN) ) {
			//Accept
			struct sockaddr_un addr;
			socklen_t addr_len = sizeof(addr);
			int nclient = accept(self->m_acceptfd, (struct sockaddr *) &addr, &addr_len);
			if (nclient >= 0)
			{
				self->Lock();
				self->m_list.push_back(nclient);
				self->Unlock();
			}
		}

		//Check eventfd and exit if it has data
		if ( (fds[1].revents & POLLIN) ) {
			busy = false;
		}

	}

	return NULL;
}